

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

bool TestEvaluation(ExpressionContext *ctx,ExprBase *expression,char *resultBuf,uint resultBufSize,
                   char *errorBuf,uint errorBufSize)

{
  undefined1 local_2b8 [8];
  ExpressionEvalContext evalCtx;
  uint errorBufSize_local;
  char *errorBuf_local;
  uint resultBufSize_local;
  char *resultBuf_local;
  ExprBase *expression_local;
  ExpressionContext *ctx_local;
  
  if (expression == (ExprBase *)0x0) {
    ctx_local._7_1_ = false;
  }
  else {
    evalCtx._628_4_ = errorBufSize;
    ExpressionEvalContext::ExpressionEvalContext
              ((ExpressionEvalContext *)local_2b8,ctx,ctx->allocator);
    evalCtx.errorBuf._0_4_ = evalCtx._628_4_;
    evalCtx.stackFrames.allocator._4_1_ = 1;
    evalCtx.ctx = (ExpressionContext *)errorBuf;
    ctx_local._7_1_ =
         EvaluateToBuffer((ExpressionEvalContext *)local_2b8,expression,resultBuf,resultBufSize);
    ExpressionEvalContext::~ExpressionEvalContext((ExpressionEvalContext *)local_2b8);
  }
  return ctx_local._7_1_;
}

Assistant:

bool TestEvaluation(ExpressionContext &ctx, ExprBase *expression, char *resultBuf, unsigned resultBufSize, char *errorBuf, unsigned errorBufSize)
{
	if(!expression)
		return false;

	ExpressionEvalContext evalCtx(ctx, ctx.allocator);

	evalCtx.errorBuf = errorBuf;
	evalCtx.errorBufSize = errorBufSize;

	evalCtx.emulateKnownExternals = true;

	return EvaluateToBuffer(evalCtx, expression, resultBuf, resultBufSize);
}